

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::invalidateBackingStore_resizeHelper
          (QWidgetPrivate *this,QPoint *oldPos,QSize *oldSize)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QWidget *rect;
  QWidgetRepaintManager *pQVar7;
  pointer pQVar8;
  QWidgetPrivate *pQVar9;
  ulong uVar10;
  QWidgetPrivate *in_RDX;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  bool hasStaticChildren;
  QWidgetRepaintManager *bs;
  bool parentAreaExposed;
  bool sizeDecreased;
  bool staticContents;
  QWidget *q;
  QRegion parentExpose_3;
  QRegion parentExpose_2;
  QRect oldRect;
  QRegion newVisible;
  QSize minSize;
  QRegion parentExpose_1;
  QRegion parentExpose;
  QRegion dirty;
  QRegion staticChildren;
  QRect oldWidgetRect;
  QRect newWidgetRect;
  QPoint offset;
  QRect *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  WidgetAttribute in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  QWidgetPrivate *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined1 local_185;
  bool local_171;
  int in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 uVar11;
  uint dx;
  QRegion local_138;
  QRegion local_130;
  QPoint local_128;
  QRegion local_120;
  QRegion local_118;
  QRegion local_110;
  QRegion local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  QRegion local_f0;
  QRegion local_e8 [5];
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  undefined1 *local_b0;
  QRect local_98;
  QRegion local_88;
  undefined1 local_80 [16];
  QRegion local_70;
  QRegion local_68;
  undefined1 local_60 [16];
  QRegion local_50;
  QRegion local_48;
  QRegion local_40;
  QRegion local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 local_20 [16];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = in_RDI;
  rect = q_func(in_RDI);
  bVar1 = QWidget::testAttribute
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe54);
  uVar11 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffea4);
  iVar3 = QRect::width(in_stack_fffffffffffffe48);
  iVar4 = QSize::width((QSize *)0x3a9fa7);
  local_171 = true;
  if (iVar4 <= iVar3) {
    iVar3 = QRect::height(in_stack_fffffffffffffe48);
    iVar4 = QSize::height((QSize *)0x3a9fda);
    local_171 = iVar3 < iVar4;
  }
  uVar11 = CONCAT13((char)((uint)uVar11 >> 0x18),CONCAT12(local_171,(short)uVar11));
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  iVar3 = QRect::x((QRect *)0x3aa017);
  iVar4 = QPoint::x((QPoint *)0x3aa025);
  iVar4 = iVar3 - iVar4;
  iVar5 = QRect::y((QRect *)0x3aa046);
  QPoint::y((QPoint *)0x3aa054);
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48);
  bVar1 = QPoint::isNull((QPoint *)in_stack_fffffffffffffe60);
  local_185 = 1;
  if (bVar1) {
    local_185 = (undefined1)((uint)uVar11 >> 0x10);
  }
  dx = CONCAT22((short)((uint)uVar11 >> 0x10),CONCAT11(local_185,(char)uVar11)) & 0xffff01ff;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (undefined1  [16])QWidget::rect((QWidget *)CONCAT44(iVar3,in_stack_fffffffffffffe68));
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  iVar6 = QSize::width((QSize *)0x3aa0f9);
  QSize::height((QSize *)0x3aa107);
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               in_stack_fffffffffffffe54,in_stack_fffffffffffffe50,
               (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48);
  if (((dx & 0x1000000) == 0) || (in_RDI->graphicsEffect != (QGraphicsEffect *)0x0)) {
    local_38.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_38);
    bVar1 = QPoint::isNull((QPoint *)in_stack_fffffffffffffe60);
    if ((bVar1) &&
       (pQVar7 = maybeRepaintManager(in_stack_fffffffffffffe60),
       pQVar7 != (QWidgetRepaintManager *)0x0)) {
      QWidgetRepaintManager::staticContents((QWidgetRepaintManager *)pQVar9,in_RSI,(QRect *)in_RDX);
      QRegion::operator=((QRegion *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (QRegion *)in_stack_fffffffffffffe48);
      QRegion::~QRegion(&local_40);
    }
    bVar2 = QRegion::isEmpty();
    bVar2 = (bVar2 ^ 0xff) & 1;
    if (bVar2 == 0) {
      invalidateBackingStore<QRect>
                ((QWidgetPrivate *)CONCAT44(iVar4,iVar5),(QRect *)CONCAT44(iVar3,iVar6));
    }
    else {
      local_48.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_48,(QRect *)local_20,Rectangle);
      QRegion::operator-=(&local_48,(QRegion *)&local_38);
      invalidateBackingStore<QRegion>
                ((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRegion *)in_stack_fffffffffffffe60);
      QRegion::~QRegion(&local_48);
    }
    if ((dx & 0x100) != 0) {
      if (((in_RDI->graphicsEffect == (QGraphicsEffect *)0x0) &&
          (bVar1 = std::unique_ptr::operator_cast_to_bool
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa286), bVar1
          )) && (pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa29d)
                , (*(ushort *)&pQVar8->field_0x7c >> 7 & 1) != 0)) {
        local_50.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa2d2);
        QRegion::translated((QRegion *)CONCAT44(iVar3,iVar6),(QPoint *)in_stack_fffffffffffffe60);
        QRect::QRect((QRect *)CONCAT44(iVar4,iVar5),(QPoint *)CONCAT44(iVar3,iVar6),
                     (QSize *)in_stack_fffffffffffffe60);
        QRegion::operator&=(&local_50,(QRect *)local_60);
        if (bVar2 != 0) {
          QRegion::QRegion(&local_68,(QRect *)&(in_RDI->data).crect,Rectangle);
          QRegion::operator-=(&local_50,(QRegion *)&local_68);
          QRegion::~QRegion(&local_68);
        }
        QWidget::parentWidget((QWidget *)0x3aa369);
        QWidget::d_func((QWidget *)0x3aa371);
        invalidateBackingStore<QRegion>
                  ((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRegion *)in_stack_fffffffffffffe60);
        QRegion::~QRegion(&local_50);
      }
      else if ((bVar2 == 0) || (in_RDI->graphicsEffect != (QGraphicsEffect *)0x0)) {
        QWidget::parentWidget((QWidget *)0x3aa46a);
        pQVar9 = QWidget::d_func((QWidget *)0x3aa472);
        QRect::QRect((QRect *)CONCAT44(iVar4,iVar5),(QPoint *)CONCAT44(iVar3,iVar6),(QSize *)pQVar9)
        ;
        local_98 = effectiveRectFor((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRect *)pQVar9);
        invalidateBackingStore<QRect>
                  ((QWidgetPrivate *)CONCAT44(iVar4,iVar5),(QRect *)CONCAT44(iVar3,iVar6));
      }
      else {
        local_70.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRect::QRect((QRect *)CONCAT44(iVar4,iVar5),(QPoint *)CONCAT44(iVar3,iVar6),
                     (QSize *)in_stack_fffffffffffffe60);
        QRegion::QRegion(&local_70,(QRect *)local_80,Rectangle);
        QRegion::QRegion(&local_88,(QRect *)&(in_RDI->data).crect,Rectangle);
        QRegion::operator-=(&local_70,(QRegion *)&local_88);
        QRegion::~QRegion(&local_88);
        QWidget::parentWidget((QWidget *)0x3aa439);
        QWidget::d_func((QWidget *)0x3aa441);
        invalidateBackingStore<QRegion>
                  ((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRegion *)in_stack_fffffffffffffe60);
        QRegion::~QRegion(&local_70);
      }
    }
    QRegion::~QRegion(&local_38);
  }
  else {
    bVar1 = QPoint::isNull((QPoint *)in_stack_fffffffffffffe60);
    if (!bVar1) {
      if ((dx & 0x10000) == 0) {
        QRect::QRect((QRect *)CONCAT44(iVar4,iVar5),(QPoint *)CONCAT44(iVar3,iVar6),
                     (QSize *)in_stack_fffffffffffffe60);
        QPoint::x((QPoint *)0x3aa620);
        QPoint::y((QPoint *)0x3aa631);
        moveRect(in_RDX,(QRect *)rect,dx,in_stack_fffffffffffffea0);
      }
      else {
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b4 = QSize::width((QSize *)0x3aa517);
        local_b8 = QRect::width(in_stack_fffffffffffffe48);
        qMin<int>(&local_b4,&local_b8);
        local_bc = QSize::height((QSize *)0x3aa55f);
        local_c0 = QRect::height(in_stack_fffffffffffffe48);
        qMin<int>(&local_bc,&local_c0);
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48)
        ;
        QRect::QRect((QRect *)CONCAT44(iVar4,iVar5),(QPoint *)CONCAT44(iVar3,iVar6),
                     (QSize *)in_stack_fffffffffffffe60);
        QPoint::x((QPoint *)0x3aa5d1);
        QPoint::y((QPoint *)0x3aa5e2);
        moveRect(in_RDX,(QRect *)rect,dx,in_stack_fffffffffffffea0);
      }
    }
    if (((dx & 0x10000) == 0) ||
       (uVar10 = QRect::contains((QRect *)&local_30,SUB81(local_20,0)), (uVar10 & 1) == 0)) {
      local_e8[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(local_e8,(QRect *)local_20,Rectangle);
      QRegion::QRegion(&local_f0,(QRect *)&local_30,Rectangle);
      QRegion::operator-=(local_e8,(QRegion *)&local_f0);
      QRegion::~QRegion(&local_f0);
      invalidateBackingStore<QRegion>
                ((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRegion *)in_stack_fffffffffffffe60);
      QRegion::~QRegion(local_e8);
    }
    if ((dx & 0x100) != 0) {
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect((QRect *)CONCAT44(iVar4,iVar5),(QPoint *)CONCAT44(iVar3,iVar6),
                   (QSize *)in_stack_fffffffffffffe60);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa73a);
      if ((bVar1) &&
         (pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa751),
         (*(ushort *)&pQVar8->field_0x7c >> 7 & 1) != 0)) {
        local_108.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_108,(QRect *)&local_100,Rectangle);
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa79d);
        QRegion::translated((QRegion *)CONCAT44(iVar3,iVar6),(QPoint *)in_stack_fffffffffffffe60);
        QRegion::operator&=(&local_108,(QRegion *)&local_110);
        QRegion::~QRegion(&local_110);
        pQVar8 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3aa7e6);
        local_128 = QRect::topLeft((QRect *)&pQVar8->mask);
        QRegion::translated((QRegion *)CONCAT44(iVar3,iVar6),(QPoint *)in_stack_fffffffffffffe60);
        QRegion::operator&(&local_118,(QRect *)&local_120);
        QRegion::operator-=(&local_108,(QRegion *)&local_118);
        QRegion::~QRegion(&local_118);
        QRegion::~QRegion(&local_120);
        QWidget::parentWidget((QWidget *)0x3aa882);
        QWidget::d_func((QWidget *)0x3aa88a);
        invalidateBackingStore<QRegion>
                  ((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRegion *)in_stack_fffffffffffffe60);
        QRegion::~QRegion(&local_108);
      }
      else {
        local_130.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_130,(QRect *)&local_100,Rectangle);
        QRegion::QRegion(&local_138,(QRect *)&(in_RDI->data).crect,Rectangle);
        QRegion::operator-=(&local_130,(QRegion *)&local_138);
        QRegion::~QRegion(&local_138);
        QWidget::parentWidget((QWidget *)0x3aa91d);
        QWidget::d_func((QWidget *)0x3aa925);
        invalidateBackingStore<QRegion>
                  ((QWidgetPrivate *)CONCAT44(iVar3,iVar6),(QRegion *)in_stack_fffffffffffffe60);
        QRegion::~QRegion(&local_130);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore_resizeHelper(const QPoint &oldPos, const QSize &oldSize)
{
    Q_Q(QWidget);
    Q_ASSERT(!q->isWindow());
    Q_ASSERT(q->parentWidget());

    const bool staticContents = q->testAttribute(Qt::WA_StaticContents);
    const bool sizeDecreased = (data.crect.width() < oldSize.width())
                               || (data.crect.height() < oldSize.height());

    const QPoint offset(data.crect.x() - oldPos.x(), data.crect.y() - oldPos.y());
    const bool parentAreaExposed = !offset.isNull() || sizeDecreased;
    const QRect newWidgetRect(q->rect());
    const QRect oldWidgetRect(0, 0, oldSize.width(), oldSize.height());

    if (!staticContents || graphicsEffect) {
        QRegion staticChildren;
        QWidgetRepaintManager *bs = nullptr;
        if (offset.isNull() && (bs = maybeRepaintManager()))
            staticChildren = bs->staticContents(q, oldWidgetRect);
        const bool hasStaticChildren = !staticChildren.isEmpty();

        if (hasStaticChildren) {
            QRegion dirty(newWidgetRect);
            dirty -= staticChildren;
            invalidateBackingStore(dirty);
        } else {
            // Entire widget needs repaint.
            invalidateBackingStore(newWidgetRect);
        }

        if (!parentAreaExposed)
            return;

        // Invalidate newly exposed area of the parent.
        if (!graphicsEffect && extra && extra->hasMask) {
            QRegion parentExpose(extra->mask.translated(oldPos));
            parentExpose &= QRect(oldPos, oldSize);
            if (hasStaticChildren)
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
            q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
        } else {
            if (hasStaticChildren && !graphicsEffect) {
                QRegion parentExpose(QRect(oldPos, oldSize));
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
                q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
            } else {
                q->parentWidget()->d_func()->invalidateBackingStore(effectiveRectFor(QRect(oldPos, oldSize)));
            }
        }
        return;
    }

    // Move static content to its new position.
    if (!offset.isNull()) {
        if (sizeDecreased) {
            const QSize minSize(qMin(oldSize.width(), data.crect.width()),
                                qMin(oldSize.height(), data.crect.height()));
            moveRect(QRect(oldPos, minSize), offset.x(), offset.y());
        } else {
            moveRect(QRect(oldPos, oldSize), offset.x(), offset.y());
        }
    }

    // Invalidate newly visible area of the widget.
    if (!sizeDecreased || !oldWidgetRect.contains(newWidgetRect)) {
        QRegion newVisible(newWidgetRect);
        newVisible -= oldWidgetRect;
        invalidateBackingStore(newVisible);
    }

    if (!parentAreaExposed)
        return;

    // Invalidate newly exposed area of the parent.
    const QRect oldRect(oldPos, oldSize);
    if (extra && extra->hasMask) {
        QRegion parentExpose(oldRect);
        parentExpose &= extra->mask.translated(oldPos);
        parentExpose -= (extra->mask.translated(data.crect.topLeft()) & data.crect);
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    } else {
        QRegion parentExpose(oldRect);
        parentExpose -= data.crect;
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    }
}